

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

void asm_href(ASMState *as,IRIns *ir,IROp merge)

{
  ushort uVar1;
  IRIns *pIVar2;
  MCode *pMVar3;
  MCode *pMVar4;
  char cVar5;
  byte bVar6;
  uint32_t uVar7;
  Reg r;
  Reg rb;
  Reg rr;
  uint r_00;
  uint uVar8;
  ulong uVar9;
  MCode *pMVar10;
  uint uVar11;
  byte bVar12;
  RegSet allow;
  x86Op xVar13;
  ulong uVar14;
  int32_t iVar15;
  uint uVar16;
  Reg r1;
  MCode *p;
  uint uVar17;
  int i;
  bool bVar18;
  
  bVar18 = true;
  if ((char)(ir->field_1).r < '\0') {
    bVar18 = (ir->field_1).s != '\0';
  }
  r = ra_dest(as,ir,0xbfef);
  uVar16 = ~(1 << (r & 0x1f)) & 0xbfef;
  rb = ra_alloc1(as,(uint)(ir->field_0).op1,uVar16);
  pIVar2 = as->ir;
  uVar1 = (ir->field_0).op2;
  uVar14 = (ulong)uVar1;
  bVar12 = *(byte *)((long)pIVar2 + uVar14 * 8 + 4);
  r_00 = 0x80;
  rr = 0x80;
  if ((short)uVar1 < 0) {
    uVar16 = uVar16 & ~(1 << (rb & 0x1f));
    allow = 0xffff0000;
    if ((bVar12 & 0x1f) != 0xe) {
      allow = uVar16;
    }
    rr = ra_alloc1(as,(uint)uVar1,allow);
    r_00 = ra_scratch(as,uVar16 & ~(1 << (rr & 0x1f)));
  }
  pMVar10 = as->mcp;
  if (merge == IR_NE) {
    asm_guardcc(as,4);
  }
  else if (bVar18) {
    emit_loadu64(as,r,(uint64_t)(as->J[-1].penalty + 0x34));
  }
  pMVar3 = as->mcp;
  pMVar3[-2] = 'u';
  pMVar3[-1] = '\0';
  as->mcp = pMVar3 + -2;
  r1 = r | 0x80200;
  emit_rr(as,XO_TEST,r1,r);
  iVar15 = 0x10;
  emit_rmro(as,XO_MOV,r1,r,0x10);
  pMVar4 = as->mcp;
  cVar5 = (char)pMVar4;
  if (merge == IR_EQ) {
    asm_guardcc(as,4);
  }
  else {
    pMVar4[-1] = (char)pMVar10 - cVar5;
    pMVar4[-2] = 't';
    as->mcp = pMVar4 + -2;
  }
  uVar17 = bVar12 & 0x1f;
  uVar16 = ~uVar17;
  if (uVar17 == 0xe) {
    if ((short)uVar1 < 0) {
      pMVar10 = as->mcp;
      pMVar10[-1] = cVar5 - (char)pMVar10;
      pMVar10[-2] = 'z';
      as->mcp = pMVar10 + -2;
      emit_rmro(as,XO_UCOMISD,rr,r,8);
      pMVar10 = as->mcp;
      pMVar10[-1] = cVar5 - (char)pMVar10;
      pMVar10[-2] = 's';
      as->mcp = pMVar10 + -3;
      pMVar10[-3] = 0xf2;
      xVar13 = XO_ARITHi8;
LAB_001405a3:
      emit_rmro(as,xVar13,7,r,0xc);
    }
    else {
      emit_gmroi(as,r,8,pIVar2[uVar14 + 1].i,iVar15);
      pMVar10 = as->mcp;
      pMVar10[-1] = cVar5 - (char)pMVar10;
      pMVar10[-2] = 'u';
      as->mcp = pMVar10 + -2;
      uVar11 = *(uint *)((long)pIVar2 + uVar14 * 8 + 0xc);
LAB_00140500:
      emit_gmroi(as,r,0xc,uVar11,iVar15);
    }
  }
  else {
    if (9 < uVar17 - 3) {
      pMVar10 = as->mcp;
      *(uint *)(pMVar10 + -4) = uVar16 << 0xf | 0x7fff;
      as->mcp = pMVar10 + -4;
      xVar13 = XO_ARITHi;
      goto LAB_001405a3;
    }
    if (-1 < (short)uVar1) {
      uVar11 = (uint)((ulong)((long)(char)(~*(byte *)((long)pIVar2 + uVar14 * 8 + 4) | 0xe0) << 0x2f
                             ) >> 0x20) | SUB84(pIVar2[uVar14 + 1].gcr,4);
      emit_gmroi(as,r,8,pIVar2[uVar14 + 1].i,iVar15);
      pMVar10 = as->mcp;
      pMVar10[-1] = cVar5 - (char)pMVar10;
      pMVar10[-2] = 'u';
      as->mcp = pMVar10 + -2;
      goto LAB_00140500;
    }
    emit_rmro(as,XO_CMP,r_00 | 0x80200,r,8);
  }
  pMVar3[-1] = (char)*(undefined4 *)&as->mcp - (char)pMVar3;
  if (as->mcp < as->mclim) goto LAB_001409ff;
  if (((short)uVar1 < 0) && (uVar17 - 3 < 10)) {
    emit_rr(as,XO_OR,r_00 | 0x80200,rr);
    emit_loadu64(as,r_00,(ulong)uVar16 << 0x2f);
LAB_0014064d:
    i = 1;
  }
  else {
    if ((short)uVar1 < 0) goto LAB_0014064d;
    uVar11 = *(byte *)((long)pIVar2 + uVar14 * 8 + 4) & 0x1f;
    if (uVar11 == 0xe) {
      uVar9 = (ulong)pIVar2[uVar14 + 1].field_1.op12;
      uVar11 = *(int *)((long)pIVar2 + uVar14 * 8 + 0xc) * 2;
LAB_001406b1:
      uVar8 = ((uint)uVar9 ^ uVar11) - (uVar11 << 0xe | uVar11 >> 0x12);
      i = ((uVar11 << 0x13 | uVar11 >> 0xd) ^ uVar8) - (uVar8 * 0x2000 | uVar8 >> 0x13);
    }
    else if (uVar11 == 4) {
      i = *(int *)((long)pIVar2[uVar14 + 1] + 0xc);
    }
    else {
      if (2 < (byte)uVar11) {
        uVar9 = pIVar2[uVar14 + 1].gcr.gcptr64;
        uVar11 = ~uVar11 << 0xf | (uint)(uVar9 >> 0x20);
        goto LAB_001406b1;
      }
      i = uVar11 - 1;
    }
    if (i == 0) {
      iVar15 = 0x28;
      goto LAB_001407d3;
    }
  }
  emit_rmro(as,0x30000fe,r1,rb,0x28);
  pMVar10 = as->mcp;
  as->mcp = pMVar10 + -1;
  pMVar10[-1] = '\x03';
  emit_rr(as,XO_SHIFTi,4,r);
  pMVar10 = as->mcp;
  bVar12 = 0;
  if ((r & 7) == 5) {
    pMVar10[-1] = '\0';
    pMVar10 = pMVar10 + -1;
    bVar12 = 0x40;
  }
  bVar6 = (char)r * '\b' & 0x38;
  pMVar10[-1] = (byte)(r & 7) | bVar6 | 0x40;
  pMVar10[-2] = bVar6 | bVar12 | 4;
  pMVar10[-3] = 0x8d;
  uVar11 = r >> 3 & 1 | r >> 1 & 4 | r >> 2 & 2;
  if (uVar11 == 0) {
    pMVar10 = pMVar10 + -3;
  }
  else {
    pMVar10[-4] = (byte)uVar11 | 0x40;
    pMVar10 = pMVar10 + -4;
  }
  as->mcp = pMVar10;
  if ((short)uVar1 < 0) {
    if ((char)uVar17 != '\x04') {
      emit_rmro(as,0x230000fe,r,rb,0x34);
      emit_rr(as,0x2b0000fe,r,r_00);
      pMVar10 = as->mcp;
      as->mcp = pMVar10 + -1;
      pMVar10[-1] = '\r';
      emit_rr(as,XO_SHIFTi,0,r_00);
      emit_rr(as,0x330000fe,r,r_00);
      pMVar10 = as->mcp;
      as->mcp = pMVar10 + -1;
      pMVar10[-1] = '\x05';
      emit_rr(as,XO_SHIFTi,0,r);
      emit_rr(as,0x2b0000fe,r_00,r);
      pMVar10 = as->mcp;
      as->mcp = pMVar10 + -1;
      pMVar10[-1] = '\x0e';
      emit_rr(as,XO_SHIFTi,0,r);
      emit_rr(as,0x330000fe,r_00,r);
      if ((char)uVar17 == '\x0e') {
        emit_rr(as,0x30000fe,r,r);
        pMVar10 = as->mcp;
        as->mcp = pMVar10 + -1;
        pMVar10[-1] = ' ';
        emit_rr(as,XO_SHIFTi,0x80205,r);
        emit_rr(as,XO_MOV,r_00,r);
        r1 = rr | 0x80200;
        xVar13 = XO_MOVDto;
      }
      else {
        emit_rr(as,XO_MOV,r_00,rr);
        if (as->mcp < as->mclim) {
LAB_001409ff:
          asm_mclimit(as);
        }
        emit_gri(as,0x838106,r,uVar16 << 0xf);
        pMVar10 = as->mcp;
        uVar7 = as->flags;
        as->mcp = pMVar10 + -1;
        pMVar10[-1] = ' ';
        if ((uVar7 & 0x40) != 0) {
          emit_mrm(as,0xf0fbe3c4,r,rr);
          return;
        }
        emit_rr(as,XO_SHIFTi,0x80205,r);
        r = rr | 0x80200;
        xVar13 = XO_MOV;
      }
      emit_rr(as,xVar13,r1,r);
      return;
    }
    emit_rmro(as,0x230000fe,r,rr,0xc);
  }
  else {
    emit_gri(as,0x838104,r,i);
  }
  iVar15 = 0x34;
  r1 = r;
LAB_001407d3:
  emit_rmro(as,XO_MOV,r1,rb,iVar15);
  return;
}

Assistant:

static void asm_href(ASMState *as, IRIns *ir, IROp merge)
{
  RegSet allow = RSET_GPR;
  int destused = ra_used(ir);
  Reg dest = ra_dest(as, ir, allow);
  Reg tab = ra_alloc1(as, ir->op1, rset_clear(allow, dest));
  Reg key = RID_NONE, tmp = RID_NONE;
  IRIns *irkey = IR(ir->op2);
  int isk = irref_isk(ir->op2);
  IRType1 kt = irkey->t;
  uint32_t khash;
  MCLabel l_end, l_loop, l_next;

  if (!isk) {
    rset_clear(allow, tab);
    key = ra_alloc1(as, ir->op2, irt_isnum(kt) ? RSET_FPR : allow);
    if (LJ_GC64 || !irt_isstr(kt))
      tmp = ra_scratch(as, rset_exclude(allow, key));
  }

  /* Key not found in chain: jump to exit (if merged) or load niltv. */
  l_end = emit_label(as);
  if (merge == IR_NE)
    asm_guardcc(as, CC_E);  /* XI_JMP is not found by lj_asm_patchexit. */
  else if (destused)
    emit_loada(as, dest, niltvg(J2G(as->J)));

  /* Follow hash chain until the end. */
  l_loop = emit_sjcc_label(as, CC_NZ);
  emit_rr(as, XO_TEST, dest|REX_GC64, dest);
  emit_rmro(as, XO_MOV, dest|REX_GC64, dest, offsetof(Node, next));
  l_next = emit_label(as);

  /* Type and value comparison. */
  if (merge == IR_EQ)
    asm_guardcc(as, CC_E);
  else
    emit_sjcc(as, CC_E, l_end);
  if (irt_isnum(kt)) {
    if (isk) {
      /* Assumes -0.0 is already canonicalized to +0.0. */
      emit_gmroi(as, XG_ARITHi(XOg_CMP), dest, offsetof(Node, key.u32.lo),
		 (int32_t)ir_knum(irkey)->u32.lo);
      emit_sjcc(as, CC_NE, l_next);
      emit_gmroi(as, XG_ARITHi(XOg_CMP), dest, offsetof(Node, key.u32.hi),
		 (int32_t)ir_knum(irkey)->u32.hi);
    } else {
      emit_sjcc(as, CC_P, l_next);
      emit_rmro(as, XO_UCOMISD, key, dest, offsetof(Node, key.n));
      emit_sjcc(as, CC_AE, l_next);
      /* The type check avoids NaN penalties and complaints from Valgrind. */
#if LJ_64 && !LJ_GC64
      emit_u32(as, LJ_TISNUM);
      emit_rmro(as, XO_ARITHi, XOg_CMP, dest, offsetof(Node, key.it));
#else
      emit_i8(as, LJ_TISNUM);
      emit_rmro(as, XO_ARITHi8, XOg_CMP, dest, offsetof(Node, key.it));
#endif
    }
#if LJ_64 && !LJ_GC64
  } else if (irt_islightud(kt)) {
    emit_rmro(as, XO_CMP, key|REX_64, dest, offsetof(Node, key.u64));
#endif
#if LJ_GC64
  } else if (irt_isaddr(kt)) {
    if (isk) {
      TValue k;
      k.u64 = ((uint64_t)irt_toitype(irkey->t) << 47) | irkey[1].tv.u64;
      emit_gmroi(as, XG_ARITHi(XOg_CMP), dest, offsetof(Node, key.u32.lo),
		 k.u32.lo);
      emit_sjcc(as, CC_NE, l_next);
      emit_gmroi(as, XG_ARITHi(XOg_CMP), dest, offsetof(Node, key.u32.hi),
		 k.u32.hi);
    } else {
      emit_rmro(as, XO_CMP, tmp|REX_64, dest, offsetof(Node, key.u64));
    }
  } else {
    lj_assertA(irt_ispri(kt) && !irt_isnil(kt), "bad HREF key type");
    emit_u32(as, (irt_toitype(kt)<<15)|0x7fff);
    emit_rmro(as, XO_ARITHi, XOg_CMP, dest, offsetof(Node, key.it));
#else
  } else {
    if (!irt_ispri(kt)) {
      lj_assertA(irt_isaddr(kt), "bad HREF key type");
      if (isk)
	emit_gmroi(as, XG_ARITHi(XOg_CMP), dest, offsetof(Node, key.gcr),
		   ptr2addr(ir_kgc(irkey)));
      else
	emit_rmro(as, XO_CMP, key, dest, offsetof(Node, key.gcr));
      emit_sjcc(as, CC_NE, l_next);
    }
    lj_assertA(!irt_isnil(kt), "bad HREF key type");
    emit_i8(as, irt_toitype(kt));
    emit_rmro(as, XO_ARITHi8, XOg_CMP, dest, offsetof(Node, key.it));
#endif
  }